

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O0

void __thiscall
nvim::NvimRPC::async_call<std::__cxx11::string,std::__cxx11::string,bool>
          (NvimRPC *this,string *method,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_1,bool *u_2)

{
  packer<msgpack::v1::sbuffer> *o;
  type ppVar1;
  char *pcVar2;
  void *__buf;
  uint64_t local_70 [4];
  packer<msgpack::v1::sbuffer> local_50;
  Packer pk;
  sbuffer sbuf;
  bool *u_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_local;
  string *method_local;
  NvimRPC *this_local;
  
  msgpack::v1::sbuffer::sbuffer((sbuffer *)&pk,0x2000);
  msgpack::v1::packer<msgpack::v1::sbuffer>::packer(&local_50,(sbuffer *)&pk);
  o = msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&local_50,4);
  local_70[1] = 0;
  ppVar1 = msgpack::v1::operator<<(o,local_70 + 1);
  local_70[0] = this->msgid_;
  this->msgid_ = local_70[0] + 1;
  ppVar1 = msgpack::v1::operator<<(ppVar1,local_70);
  msgpack::v1::operator<<(ppVar1,method);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&local_50,3);
  nvim::detail::pack<std::__cxx11::string,std::__cxx11::string,bool>(&local_50,u,u_1,u_2);
  pcVar2 = msgpack::v1::sbuffer::data((sbuffer *)&pk);
  __buf = (void *)msgpack::v1::sbuffer::size((sbuffer *)&pk);
  Socket::write(&this->socket_,(int)pcVar2,__buf,(size_t)u_2);
  msgpack::v1::sbuffer::~sbuffer((sbuffer *)&pk);
  return;
}

Assistant:

void NvimRPC::async_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    socket_.write(sbuf.data(), sbuf.size(), 5);
}